

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O1

void __thiscall
nigel::Linker::printToFile
          (Linker *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,path *file)

{
  char *pcVar1;
  uint uVar2;
  pointer puVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_t sVar6;
  ulong *puVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  u8 uVar10;
  ulong uVar11;
  undefined8 uVar12;
  char cVar13;
  ulong uVar14;
  String out;
  String fileStr;
  ofstream filestream;
  long *local_388;
  undefined8 local_380;
  long local_378;
  undefined8 uStack_370;
  long *local_368;
  undefined8 local_360;
  long local_358;
  undefined8 uStack_350;
  ulong *local_348;
  long local_340;
  ulong local_338;
  long lStack_330;
  ulong *local_328;
  long local_320;
  ulong local_318;
  long lStack_310;
  string local_308;
  string local_2e8;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  undefined1 local_298;
  undefined7 uStack_297;
  uint local_284;
  string local_280;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_260;
  long *local_258 [2];
  long local_248 [2];
  string *local_238;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  uint auStack_210 [54];
  ios_base local_138 [264];
  
  local_258[0] = local_248;
  local_238 = (string *)file;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
  local_2a8 = &local_298;
  local_2a0 = (char *)0x0;
  local_298 = 0;
  puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_260 = data;
  if ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar3) {
    uVar2 = 0;
    cVar13 = '\0';
  }
  else {
    uVar14 = 0;
    cVar13 = '\0';
    uVar2 = 0;
    do {
      helper::int_to_hex<unsigned_char>((string *)local_230,puVar3[uVar14]);
      std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_230);
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
      }
      cVar13 = cVar13 + (local_260->
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar14];
      if ((char *)0x1f < local_2a0) {
        uVar10 = (u8)((ulong)local_2a0 >> 1);
        helper::int_to_hex<unsigned_char>(&local_280,uVar10);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,0x176c7b);
        local_348 = &local_338;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_338 = *puVar7;
          lStack_330 = plVar4[3];
        }
        else {
          local_338 = *puVar7;
          local_348 = (ulong *)*plVar4;
        }
        local_340 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        local_284 = uVar2;
        helper::int_to_hex<unsigned_short>(&local_2e8,(unsigned_short)uVar2);
        uVar11 = 0xf;
        if (local_348 != &local_338) {
          uVar11 = local_338;
        }
        if (uVar11 < local_2e8._M_string_length + local_340) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            uVar12 = local_2e8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_2e8._M_string_length + local_340) goto LAB_0016cc84;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_348);
        }
        else {
LAB_0016cc84:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_348,(ulong)local_2e8._M_dataplus._M_p);
        }
        local_388 = &local_378;
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_378 = *plVar4;
          uStack_370 = puVar5[3];
        }
        else {
          local_378 = *plVar4;
          local_388 = (long *)*puVar5;
        }
        local_380 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)plVar4 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_388);
        local_2c8 = &local_2b8;
        plVar8 = plVar4 + 2;
        if ((long *)*plVar4 == plVar8) {
          local_2b8 = *plVar8;
          lStack_2b0 = plVar4[3];
        }
        else {
          local_2b8 = *plVar8;
          local_2c8 = (long *)*plVar4;
        }
        local_2c0 = plVar4[1];
        *plVar4 = (long)plVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_2a8);
        local_328 = &local_318;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_318 = *puVar7;
          lStack_310 = plVar4[3];
        }
        else {
          local_318 = *puVar7;
          local_328 = (ulong *)*plVar4;
        }
        local_320 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        helper::int_to_hex<unsigned_char>
                  (&local_308,
                   -(cVar13 + uVar10 + (char)((uVar2 & 0xffff) >> 8) + (char)(uVar2 & 0xffff)));
        uVar11 = 0xf;
        if (local_328 != &local_318) {
          uVar11 = local_318;
        }
        if (uVar11 < local_308._M_string_length + local_320) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            uVar12 = local_308.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_308._M_string_length + local_320) goto LAB_0016ce33;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,(ulong)local_328);
        }
        else {
LAB_0016ce33:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_328,(ulong)local_308._M_dataplus._M_p);
        }
        local_368 = &local_358;
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_358 = *plVar4;
          uStack_350 = puVar5[3];
        }
        else {
          local_358 = *plVar4;
          local_368 = (long *)*puVar5;
        }
        local_360 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)plVar4 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_368);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 == paVar9) {
          local_220._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_220._8_8_ = plVar4[3];
          local_230 = (undefined1  [8])&local_220;
        }
        else {
          local_220._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_230 = (undefined1  [8])*plVar4;
        }
        local_228 = plVar4[1];
        *plVar4 = (long)paVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_258,(ulong)local_230);
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
        }
        if (local_368 != &local_358) {
          operator_delete(local_368,local_358 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        if (local_328 != &local_318) {
          operator_delete(local_328,local_318 + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,local_2b8 + 1);
        }
        if (local_388 != &local_378) {
          operator_delete(local_388,local_378 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if (local_348 != &local_338) {
          operator_delete(local_348,local_338 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        pcVar1 = local_2a0;
        cVar13 = '\0';
        std::__cxx11::string::_M_replace((ulong)&local_2a8,0,local_2a0,0x177a34);
        uVar2 = local_284 + ((uint)((ulong)pcVar1 >> 1) & 0x7fffffff);
      }
      uVar14 = uVar14 + 1;
      puVar3 = (local_260->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(local_260->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3));
  }
  if (local_2a0 == (char *)0x0) goto LAB_0016d4f1;
  uVar10 = (u8)((ulong)local_2a0 >> 1);
  helper::int_to_hex<unsigned_char>(&local_280,uVar10);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,0x176c7b);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_338 = *puVar7;
    lStack_330 = plVar4[3];
    local_348 = &local_338;
  }
  else {
    local_338 = *puVar7;
    local_348 = (ulong *)*plVar4;
  }
  local_340 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  helper::int_to_hex<unsigned_short>(&local_2e8,(unsigned_short)uVar2);
  uVar14 = 0xf;
  if (local_348 != &local_338) {
    uVar14 = local_338;
  }
  if (uVar14 < local_2e8._M_string_length + local_340) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      uVar12 = local_2e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_2e8._M_string_length + local_340) goto LAB_0016d16b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_348);
  }
  else {
LAB_0016d16b:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_2e8._M_dataplus._M_p);
  }
  local_388 = &local_378;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_378 = *plVar4;
    uStack_370 = puVar5[3];
  }
  else {
    local_378 = *plVar4;
    local_388 = (long *)*puVar5;
  }
  local_380 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_388);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_2b8 = *plVar8;
    lStack_2b0 = plVar4[3];
    local_2c8 = &local_2b8;
  }
  else {
    local_2b8 = *plVar8;
    local_2c8 = (long *)*plVar4;
  }
  local_2c0 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_2a8);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_318 = *puVar7;
    lStack_310 = plVar4[3];
    local_328 = &local_318;
  }
  else {
    local_318 = *puVar7;
    local_328 = (ulong *)*plVar4;
  }
  local_320 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  helper::int_to_hex<unsigned_char>
            (&local_308,-(cVar13 + (char)((uVar2 & 0xffff) >> 8) + (char)(uVar2 & 0xffff) + uVar10))
  ;
  uVar14 = 0xf;
  if (local_328 != &local_318) {
    uVar14 = local_318;
  }
  if (uVar14 < local_308._M_string_length + local_320) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      uVar12 = local_308.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_308._M_string_length + local_320) goto LAB_0016d302;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,(ulong)local_328);
  }
  else {
LAB_0016d302:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_308._M_dataplus._M_p);
  }
  local_368 = &local_358;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_358 = *plVar4;
    uStack_350 = puVar5[3];
  }
  else {
    local_358 = *plVar4;
    local_368 = (long *)*puVar5;
  }
  local_360 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_368);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar9) {
    local_220._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_220._8_8_ = plVar4[3];
    local_230 = (undefined1  [8])&local_220;
  }
  else {
    local_220._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_230 = (undefined1  [8])*plVar4;
  }
  local_228 = plVar4[1];
  *plVar4 = (long)paVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_258,(ulong)local_230);
  if (local_230 != (undefined1  [8])&local_220) {
    operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368,local_358 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if (local_328 != &local_318) {
    operator_delete(local_328,local_318 + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,local_2b8 + 1);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388,local_378 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348,local_338 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
LAB_0016d4f1:
  std::__cxx11::string::append((char *)local_258);
  std::ofstream::ofstream(local_230,local_238,_S_bin);
  plVar4 = local_258[0];
  if ((*(uint *)((long)auStack_210 + *(long *)((long)local_230 + -0x18)) & 5) == 0) {
    if (local_258[0] == (long *)0x0) {
      std::ios::clear((int)&local_388 + (int)*(long *)((long)local_230 + -0x18) + 0x158);
    }
    else {
      sVar6 = strlen((char *)local_258[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,(char *)plVar4,sVar6);
    }
    std::ofstream::close();
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,CONCAT71(uStack_297,local_298) + 1);
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  return;
}

Assistant:

void Linker::printToFile( const std::vector<u8>& data, fs::path file )
	{
		String fileStr = "";
		String out;
		u16 startAddr = 0;
		u16 checksum = 0;
		for( size_t i = 0 ; i < data.size() ; i++ )
		{
			out += int_to_hex( data[i] );
			checksum += data[i];

			if( out.size() >= 32 )
			{
				checksum += ( out.size() / 2 ) + ( startAddr & 0xff ) + ( startAddr >> 8 );
				fileStr += ":" + int_to_hex( static_cast< u8 >( out.size() / 2 ) ) + int_to_hex( startAddr ) + "00" + out + int_to_hex( static_cast< u8 >( ~( checksum % 256 )+1 ) ) + "\r\n";
				checksum = 0;
				startAddr += static_cast< u16 >( out.size() / 2 );
				out = "";
            }
		}
		if( out.size() > 0 )
		{
			checksum += ( out.size() / 2 ) + ( startAddr & 0xff ) + ( startAddr >> 8 );
			fileStr += ":" + int_to_hex( static_cast< u8 >( out.size() / 2 ) ) + int_to_hex( startAddr ) + "00" + out + int_to_hex( static_cast< u8 >( ~( checksum % 256 )+1 ) ) + "\r\n";
		}
		fileStr += ":00000001FF";


		std::ofstream filestream( file.string(), std::ios_base::binary );

		if( filestream )
		{
			filestream << fileStr.c_str();
			filestream.close();
		}
	}